

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O3

void __thiscall
InterpTest_HostFunc_PingPong_SameThread_Test::TestBody
          (InterpTest_HostFunc_PingPong_SameThread_Test *this)

{
  Store *store;
  size_t sVar1;
  Func *this_00;
  int line;
  Type type;
  char *pcVar2;
  Result result;
  Values results;
  Thread thread;
  undefined1 local_1f0 [8];
  Store *local_1e8;
  Index local_1e0;
  AssertHelper local_1d8;
  Result local_1cc;
  Values local_1c8;
  RefVec local_1a8;
  RefPtr<wabt::interp::HostFunc> local_190;
  Ptr local_178;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_158;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_138;
  FuncType local_118;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  Thread local_b8;
  
  local_b8.frames_.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
  local_b8.frames_.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)&local_b8.frames_.
                 super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
                 _M_impl.super__Vector_impl_data._M_start[1].values;
  ((local_b8.frames_.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
    _M_impl.super__Vector_impl_data._M_start)->func).index = 0x16d736100;
  (local_b8.frames_.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
   _M_impl.super__Vector_impl_data._M_start)->values = 0x60010601;
  (local_b8.frames_.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
   _M_impl.super__Vector_impl_data._M_start)->exceptions = 0x7f017f01;
  *(undefined8 *)
   &(local_b8.frames_.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
     _M_impl.super__Vector_impl_data._M_start)->offset = 0x660100010602;
  (local_b8.frames_.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
   _M_impl.super__Vector_impl_data._M_start)->inst = (Instance *)0x101050700010203;
  (local_b8.frames_.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
   _M_impl.super__Vector_impl_data._M_start)->mod = (Module *)0x9010b0a010067;
  local_b8.frames_.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
  _M_impl.super__Vector_impl_data._M_start[1].func.index = 0xb00106a01410020;
  local_b8.frames_.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_b8.frames_.
       super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
       super__Vector_impl_data._M_finish;
  InterpTest::ReadModule
            (&this->super_InterpTest,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8);
  if (local_b8.frames_.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.frames_.
                    super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.frames_.
                          super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.frames_.
                          super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  store = &(this->super_InterpTest).store_;
  wabt::interp::Thread::Thread(&local_b8,store,(Stream *)0x0);
  local_138.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(8);
  local_138.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_138.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  (local_138.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
   super__Vector_impl_data._M_start)->enum_ = I32;
  (local_138.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
   super__Vector_impl_data._M_start)->type_index_ = 0;
  local_158.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_138.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_158.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(8);
  local_158.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_158.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  (local_158.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
   super__Vector_impl_data._M_start)->enum_ = I32;
  (local_158.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
   super__Vector_impl_data._M_start)->type_index_ = 0;
  local_118.super_ExternType.kind = First;
  local_118.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00246130;
  local_158.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_158.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_118.params,&local_138);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_118.results,&local_158);
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc:353:21)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc:353:21)>
             ::_M_manager;
  local_d8._M_unused._M_object = this;
  wabt::interp::Store::
  Alloc<wabt::interp::HostFunc,wabt::interp::Store&,wabt::interp::FuncType&,std::function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>&>
            (&local_190,store,store,&local_118,
             (function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
              *)&local_d8);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  local_118.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00246130;
  if (local_118.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.results.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.results.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_118.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.params.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.params.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_158.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_158.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_138.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  sVar1 = ((local_190.obj_)->super_Func).super_Extern.super_Object.self_.index;
  local_1a8.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(8);
  local_1a8.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1a8.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  (local_1a8.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
   super__Vector_impl_data._M_start)->index = sVar1;
  local_1a8.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1a8.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
       super__Vector_impl_data._M_finish;
  InterpTest::Instantiate(&this->super_InterpTest,&local_1a8);
  if (local_1a8.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a8.
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_1a8.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.root_index_ = 0;
  local_178.obj_ = (Trap *)0x0;
  local_178.store_ = (Store *)0x0;
  InterpTest::GetFuncExport((Ptr *)local_1f0,&this->super_InterpTest,0);
  this_00 = (Func *)CONCAT71(local_1f0._1_7_,local_1f0[0]);
  local_1c8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
  local_1c8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1c8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
       _M_impl.super__Vector_impl_data._M_start + 1;
  ((local_1c8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_start)->field_0).i64_ = 1;
  *(undefined8 *)
   ((long)&(local_1c8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
            _M_impl.super__Vector_impl_data._M_start)->field_0 + 8) = 0;
  local_1c8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1c8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_1cc = wabt::interp::Func::Call(this_00,&local_b8,&local_1c8,(Values *)&local_1a8,&local_178)
  ;
  if (local_1c8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (CONCAT71(local_1f0._1_7_,local_1f0[0]) != 0) {
    wabt::interp::Store::DeleteRoot(local_1e8,local_1e0);
  }
  local_1c8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_1c8.
                        super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
            ((internal *)local_1f0,"Result::Ok","result",(Enum *)&local_1c8,&local_1cc);
  if (local_1f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c8);
    if (local_1e8 == (Store *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)&local_1e8->features_;
    }
    type = kFatalFailure;
    line = 0x176;
  }
  else {
    if (local_1e8 != (Store *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
    }
    local_1d8.data_._0_4_ = 1;
    local_1c8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)local_1a8.
                         super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1a8.
                         super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 4);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_1f0,"1u","results.size()",(uint *)&local_1d8,
               (unsigned_long *)&local_1c8);
    if (local_1f0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_1c8);
      if (local_1e8 == (Store *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)&local_1e8->features_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
                 ,0x177,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1c8);
      testing::internal::AssertHelper::~AssertHelper(&local_1d8);
      if (local_1c8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(((local_1c8.
                       super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_0).i64_ + 8))();
      }
    }
    if (local_1e8 != (Store *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
    }
    local_1c8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_1c8.
                           super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0xb);
    local_1d8.data_._0_4_ =
         (undefined4)
         (local_1a8.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
          _M_impl.super__Vector_impl_data._M_start)->index;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)local_1f0,"11u","results[0].Get<u32>()",(uint *)&local_1c8,
               (uint *)&local_1d8);
    if (local_1f0[0] != (internal)0x0) goto LAB_00140c52;
    testing::Message::Message((Message *)&local_1c8);
    if (local_1e8 == (Store *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)&local_1e8->features_;
    }
    type = kNonFatalFailure;
    line = 0x178;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_1d8,type,
             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
             ,line,pcVar2);
  testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1c8);
  testing::internal::AssertHelper::~AssertHelper(&local_1d8);
  if (local_1c8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)(((local_1c8.
                   super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                   _M_impl.super__Vector_impl_data._M_start)->field_0).i64_ + 8))();
  }
LAB_00140c52:
  if (local_1e8 != (Store *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
  }
  if (local_178.obj_ != (Trap *)0x0) {
    wabt::interp::Store::DeleteRoot(local_178.store_,local_178.root_index_);
  }
  if (local_1a8.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a8.
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_190.obj_ != (HostFunc *)0x0) {
    wabt::interp::Store::DeleteRoot(local_190.store_,local_190.root_index_);
  }
  wabt::interp::Thread::~Thread(&local_b8);
  return;
}

Assistant:

TEST_F(InterpTest, HostFunc_PingPong_SameThread) {
  // (import "" "f" (func $f (param i32) (result i32)))
  // (func (export "g") (param i32) (result i32)
  //   (call $f (i32.add (local.get 0) (i32.const 1))))
  ReadModule({
      0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00, 0x01, 0x06, 0x01, 0x60,
      0x01, 0x7f, 0x01, 0x7f, 0x02, 0x06, 0x01, 0x00, 0x01, 0x66, 0x00, 0x00,
      0x03, 0x02, 0x01, 0x00, 0x07, 0x05, 0x01, 0x01, 0x67, 0x00, 0x01, 0x0a,
      0x0b, 0x01, 0x09, 0x00, 0x20, 0x00, 0x41, 0x01, 0x6a, 0x10, 0x00, 0x0b,
  });

  Thread thread(store_);

  auto host_func =
      HostFunc::New(store_, FuncType{{ValueType::I32}, {ValueType::I32}},
                    [&](Thread& t, const Values& params, Values& results,
                        Trap::Ptr* out_trap) -> Result {
                      auto val = params[0].Get<u32>();
                      if (val < 10) {
                        return GetFuncExport(0)->Call(t, {Value::Make(val * 2)},
                                                      results, out_trap);
                      }
                      results[0] = Value::Make(val);
                      return Result::Ok;
                    });

  Instantiate({host_func->self()});

  // Should produce the following calls:
  //  g(1) -> f(2) -> g(4) -> f(5) -> g(10) -> f(11) -> return 11

  Values results;
  Trap::Ptr trap;
  Result result =
      GetFuncExport(0)->Call(thread, {Value::Make(1)}, results, &trap);

  ASSERT_EQ(Result::Ok, result);
  EXPECT_EQ(1u, results.size());
  EXPECT_EQ(11u, results[0].Get<u32>());
}